

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Render(void)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  int n_1;
  ImGuiWindow *window;
  int n;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiContext *g;
  ImU32 in_stack_00000154;
  ImU32 in_stack_00000158;
  ImU32 in_stack_0000015c;
  ImGuiMouseCursor in_stack_00000160;
  float in_stack_00000164;
  ImDrawList *in_stack_00000168;
  ImVec2 in_stack_00000170;
  ImGuiWindow *pIVar3;
  ImDrawDataBuilder *in_stack_ffffffffffffffc0;
  ImGuiWindow *window_00;
  ImVec2 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  ImGuiWindow *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  ImGuiWindow *local_18 [2];
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x10b1,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  local_8->FrameCountRendered = local_8->FrameCount;
  (local_8->IO).MetricsRenderWindows = 0;
  ImDrawDataBuilder::Clear(in_stack_ffffffffffffffc0);
  bVar1 = ImVector<ImDrawVert>::empty(&(local_8->BackgroundDrawList).VtxBuffer);
  if (!bVar1) {
    AddDrawListToDrawData
              ((ImVector<ImDrawList_*> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (ImDrawList *)in_stack_ffffffffffffffc8);
  }
  if ((local_8->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     ((local_8->NavWindowingTarget->Flags & 0x2000U) != 0)) {
    window_00 = (ImGuiWindow *)0x0;
  }
  else {
    window_00 = local_8->NavWindowingTarget->RootWindow;
  }
  local_18[0] = window_00;
  if (local_8->NavWindowingTarget == (ImGuiWindow *)0x0) {
    pIVar3 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar3 = local_8->NavWindowingListWindow;
  }
  local_18[1] = pIVar3;
  for (iVar5 = 0; iVar5 != (local_8->Windows).Size; iVar5 = iVar5 + 1) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)window_00,(int)((ulong)pIVar3 >> 0x20));
    in_stack_ffffffffffffffd8 = *ppIVar2;
    bVar1 = IsWindowActiveAndVisible(in_stack_ffffffffffffffd8);
    if ((((bVar1) && ((in_stack_ffffffffffffffd8->Flags & 0x1000000U) == 0)) &&
        (in_stack_ffffffffffffffd8 != local_18[0])) && (in_stack_ffffffffffffffd8 != local_18[1])) {
      AddRootWindowToDrawData(window_00);
    }
  }
  for (iVar4 = 0; iVar4 < 2; iVar4 = iVar4 + 1) {
    if ((local_18[iVar4] != (ImGuiWindow *)0x0) &&
       (bVar1 = IsWindowActiveAndVisible(local_18[iVar4]), bVar1)) {
      AddRootWindowToDrawData(window_00);
    }
  }
  ImDrawDataBuilder::FlattenIntoSingleLayer
            ((ImDrawDataBuilder *)CONCAT44(iVar5,in_stack_ffffffffffffffe0));
  if (((local_8->IO).MouseDrawCursor & 1U) != 0) {
    in_stack_ffffffffffffffc8 = (local_8->IO).MousePos;
    RenderMouseCursor(in_stack_00000168,in_stack_00000170,in_stack_00000164,in_stack_00000160,
                      in_stack_0000015c,in_stack_00000158,in_stack_00000154);
  }
  bVar1 = ImVector<ImDrawVert>::empty(&(local_8->ForegroundDrawList).VtxBuffer);
  if (!bVar1) {
    AddDrawListToDrawData
              ((ImVector<ImDrawList_*> *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
               (ImDrawList *)in_stack_ffffffffffffffc8);
  }
  SetupDrawData((ImVector<ImDrawList_*> *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                (ImDrawData *)in_stack_ffffffffffffffd8);
  (local_8->IO).MetricsRenderVertices = (local_8->DrawData).TotalVtxCount;
  (local_8->IO).MetricsRenderIndices = (local_8->DrawData).TotalIdxCount;
  if ((0 < (local_8->DrawData).CmdListsCount) &&
     ((local_8->IO).RenderDrawListsFn != (_func_void_ImDrawData_ptr *)0x0)) {
    (*(local_8->IO).RenderDrawListsFn)(&local_8->DrawData);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();

    // Add background ImDrawList
    if (!g.BackgroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.BackgroundDrawList);

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.ForegroundDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Add foreground ImDrawList
    if (!g.ForegroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.ForegroundDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}